

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O2

int pele::physics::reactions::ReactorCvode::cF_RHS
              (realtype t,N_Vector y_in,N_Vector ydot_in,void *user_data)

{
  int iVar1;
  realtype *prVar2;
  int icell;
  anon_class_64_8_23bb4f56 local_60;
  
  prVar2 = N_VGetArrayPointer(y_in);
  local_60.ydot_d = N_VGetArrayPointer(ydot_in);
  *(realtype *)user_data = t;
  iVar1 = *(int *)((long)user_data + 8);
  local_60.reactor_type = *(int *)((long)user_data + 0x14);
  local_60.rYsrc_ext = *(Real **)((long)user_data + 0x38);
  local_60.rhoe_init = *(Real **)((long)user_data + 0x28);
  local_60.rhoesrc_ext = *(Real **)((long)user_data + 0x30);
  local_60.ncells = iVar1;
  local_60.dt_save = t;
  local_60.yvec_d = prVar2;
  if (0 < iVar1) {
    icell = 0;
    do {
      cF_RHS::anon_class_64_8_23bb4f56::operator()(&local_60,icell);
      icell = icell + 1;
    } while (iVar1 != icell);
  }
  amrex::Gpu::Device::streamSynchronize();
  return 0;
}

Assistant:

int
ReactorCvode::cF_RHS(
  realtype t, N_Vector y_in, N_Vector ydot_in, void* user_data)
{
  BL_PROFILE("Pele::ReactorCvode::cF_RHS()");
#ifdef AMREX_USE_GPU
  amrex::Real* yvec_d = N_VGetDeviceArrayPointer(y_in);
  amrex::Real* ydot_d = N_VGetDeviceArrayPointer(ydot_in);
#else
  amrex::Real* yvec_d = N_VGetArrayPointer(y_in);
  amrex::Real* ydot_d = N_VGetArrayPointer(ydot_in);
#endif

  auto* udata = static_cast<CVODEUserData*>(user_data);
  udata->dt_save = t;

  const auto ncells = udata->ncells;
  const auto dt_save = udata->dt_save;
  const auto reactor_type = udata->reactor_type;
  auto* rhoe_init = udata->rhoe_init;
  auto* rhoesrc_ext = udata->rhoesrc_ext;
  auto* rYsrc_ext = udata->rYsrc_ext;
  amrex::ParallelFor(ncells, [=] AMREX_GPU_DEVICE(int icell) noexcept {
    utils::fKernelSpec<Ordering>(
      icell, ncells, dt_save, reactor_type, yvec_d, ydot_d, rhoe_init,
      rhoesrc_ext, rYsrc_ext);
  });
  amrex::Gpu::Device::streamSynchronize();
  return 0;
}